

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathArcToFast
          (ImDrawList *this,ImVec2 *center,float radius,int a_min_of_12,int a_max_of_12)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  int iVar3;
  ImVec2 *pIVar4;
  ImVec2 IVar5;
  ImVec2 *pIVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int a;
  
  iVar9 = (this->_Path).Size;
  if (radius == 0.0 || a_max_of_12 < a_min_of_12) {
    iVar3 = (this->_Path).Capacity;
    if (iVar9 == iVar3) {
      if (iVar3 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar3 / 2 + iVar3;
      }
      iVar8 = iVar9 + 1;
      if (iVar9 + 1 < iVar7) {
        iVar8 = iVar7;
      }
      if (iVar3 < iVar8) {
        pIVar6 = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
        pIVar4 = (this->_Path).Data;
        if (pIVar4 != (ImVec2 *)0x0) {
          memcpy(pIVar6,pIVar4,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar6;
        (this->_Path).Capacity = iVar8;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *center;
    (this->_Path).Size = (this->_Path).Size + 1;
  }
  else {
    iVar9 = (a_max_of_12 - a_min_of_12) + iVar9 + 1;
    if ((this->_Path).Capacity < iVar9) {
      pIVar6 = (ImVec2 *)ImGui::MemAlloc((long)iVar9 << 3);
      pIVar4 = (this->_Path).Data;
      if (pIVar4 != (ImVec2 *)0x0) {
        memcpy(pIVar6,pIVar4,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar6;
      (this->_Path).Capacity = iVar9;
    }
    if (a_min_of_12 <= a_max_of_12) {
      do {
        IVar1 = *center;
        IVar2 = this->_Data->ArcFastVtx
                [(int)(a_min_of_12 +
                      (((uint)(a_min_of_12 / 6 + (a_min_of_12 >> 0x1f)) >> 1) -
                      (a_min_of_12 >> 0x1f)) * -0xc)];
        iVar9 = (this->_Path).Size;
        iVar3 = (this->_Path).Capacity;
        if (iVar9 == iVar3) {
          if (iVar3 == 0) {
            iVar7 = 8;
          }
          else {
            iVar7 = iVar3 / 2 + iVar3;
          }
          iVar9 = iVar9 + 1;
          if (iVar9 < iVar7) {
            iVar9 = iVar7;
          }
          if (iVar3 < iVar9) {
            pIVar6 = (ImVec2 *)ImGui::MemAlloc((long)iVar9 << 3);
            pIVar4 = (this->_Path).Data;
            if (pIVar4 != (ImVec2 *)0x0) {
              memcpy(pIVar6,pIVar4,(long)(this->_Path).Size << 3);
              ImGui::MemFree((this->_Path).Data);
            }
            (this->_Path).Data = pIVar6;
            (this->_Path).Capacity = iVar9;
          }
        }
        IVar5.y = IVar2.y * radius + IVar1.y;
        IVar5.x = IVar2.x * radius + IVar1.x;
        (this->_Path).Data[(this->_Path).Size] = IVar5;
        (this->_Path).Size = (this->_Path).Size + 1;
        a_min_of_12 = a_min_of_12 + 1;
      } while (a_max_of_12 + 1 != a_min_of_12);
    }
  }
  return;
}

Assistant:

void ImDrawList::PathArcToFast(const ImVec2& center, float radius, int a_min_of_12, int a_max_of_12)
{
    if (radius == 0.0f || a_min_of_12 > a_max_of_12)
    {
        _Path.push_back(center);
        return;
    }

    // For legacy reason the PathArcToFast() always takes angles where 2*PI is represented by 12,
    // but it is possible to set IM_DRAWLIST_ARCFAST_TESSELATION_MULTIPLIER to a higher value. This should compile to a no-op otherwise.
#if IM_DRAWLIST_ARCFAST_TESSELLATION_MULTIPLIER != 1
    a_min_of_12 *= IM_DRAWLIST_ARCFAST_TESSELLATION_MULTIPLIER;
    a_max_of_12 *= IM_DRAWLIST_ARCFAST_TESSELLATION_MULTIPLIER;
#endif

    _Path.reserve(_Path.Size + (a_max_of_12 - a_min_of_12 + 1));
    for (int a = a_min_of_12; a <= a_max_of_12; a++)
    {
        const ImVec2& c = _Data->ArcFastVtx[a % IM_ARRAYSIZE(_Data->ArcFastVtx)];
        _Path.push_back(ImVec2(center.x + c.x * radius, center.y + c.y * radius));
    }
}